

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RSA.h
# Opt level: O3

void __thiscall RSA::print_last_ciphertext_line(RSA *this)

{
  long *plVar1;
  long *plVar2;
  ostream *poVar3;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Cipher Text","");
  Crypto::print_header(&this->super_Crypto,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Text: ",6);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(this->super_Crypto).cipherText._M_dataplus._M_p,
                      (this->super_Crypto).cipherText._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  plVar1 = (this->cipher_BigInt).vector_value.
           super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
           ._M_start;
  plVar2 = (this->cipher_BigInt).vector_value.
           super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
           ._M_finish;
  if ((plVar1 != plVar2) && (((long)plVar2 - (long)plVar1 != 8 || (*plVar1 != 0)))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Num: ",5);
    poVar3 = operator<<((ostream *)&std::cout,&this->cipher_BigInt);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  return;
}

Assistant:

void RSA::print_last_ciphertext_line() {
    print_header("Cipher Text");
    cout << "Text: " << cipherText << endl;
    if (!cipher_BigInt.isZero())
        cout << "Num: " << cipher_BigInt << endl;

}